

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O2

zt_mem_pool_group * zt_mem_pool_group_init(zt_mem_pool_desc *group,size_t len)

{
  zt_mem_pool_group *pzVar1;
  zt_mem_pool **ppzVar2;
  zt_mem_pool *pzVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 1;
  pzVar1 = (zt_mem_pool_group *)zt_calloc_p(1,0x20);
  if (pzVar1 != (zt_mem_pool_group *)0x0) {
    ppzVar2 = (zt_mem_pool **)zt_calloc_p(len,8);
    pzVar1->pools = ppzVar2;
    if (ppzVar2 != (zt_mem_pool **)0x0) {
      (pzVar1->group_list).prev = (zt_elist *)pzVar1;
      (pzVar1->group_list).next = (zt_elist *)pzVar1;
      pzVar1->npools = len;
      piVar4 = &group->flags;
      lVar5 = -8;
      while( true ) {
        if (len + lVar6 == 1) {
          return pzVar1;
        }
        if (((zt_mem_pool_desc *)(piVar4 + -10))->name == (char *)0x0) {
          return pzVar1;
        }
        pzVar3 = zt_mem_pool_init(((zt_mem_pool_desc *)(piVar4 + -10))->name,
                                  *(size_t *)(piVar4 + -8),*(size_t *)(piVar4 + -6),
                                  *(zt_page_release_test *)(piVar4 + -4),*(void **)(piVar4 + -2),
                                  *piVar4);
        *(zt_mem_pool **)((long)pzVar1->pools + lVar5 + 8) = pzVar3;
        if (*(long *)((long)pzVar1->pools + lVar5 + 8) == 0) break;
        lVar5 = lVar5 + 8;
        lVar6 = lVar6 + -1;
        piVar4 = piVar4 + 0xc;
      }
      for (; lVar6 != 0; lVar6 = lVar6 + 1) {
        zt_mem_pool_destroy((zt_mem_pool **)((long)pzVar1->pools + lVar5));
        lVar5 = lVar5 + -8;
      }
    }
  }
  return (zt_mem_pool_group *)0x0;
}

Assistant:

zt_mem_pool_group *
zt_mem_pool_group_init(zt_mem_pool_desc *group, size_t len)
{
    zt_mem_pool_group * ngroup;
    size_t              i;

    if ((ngroup = zt_calloc(zt_mem_pool_group, 1)) == NULL) {
        return 0;
    }

    if ((ngroup->pools = zt_calloc(zt_mem_pool *, len)) == NULL) {
        return 0;
    }
    zt_elist_reset(&ngroup->group_list);
    ngroup->npools = len;

    for (i = 0; i < len && group[i].name; i++) {
        ngroup->pools[i] = zt_mem_pool_init(group[i].name,
                                            group[i].elts,
                                            group[i].size,
                                            group[i].release_test,
                                            group[i].cb_data,
                                            group[i].flags);
        if (!ngroup->pools[i]) {
            while (--i) {
                zt_mem_pool_destroy(&ngroup->pools[i]);
            }
            return 0;
        }
    }

    return ngroup;
}